

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::
Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
::expand(Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
         *this)

{
  IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
  *pIVar1;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
  *in_RDI;
  size_t i;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
  *newStack;
  void *mem;
  size_t newCapacity;
  IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
  *local_38;
  IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
  *local_28;
  
  if (in_RDI->_core ==
      (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
       *)0x0) {
    local_38 = (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
                *)0x8;
  }
  else {
    local_38 = (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
                *)((long)in_RDI->_core << 1);
  }
  pIVar1 = (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
            *)Lib::alloc((size_t)in_RDI);
  if (in_RDI->_core !=
      (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
       *)0x0) {
    for (local_28 = (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
                     *)0x0; local_28 < in_RDI->_core;
        local_28 = (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
                    *)((long)&local_28->_vptr_IteratorCore + 1)) {
      VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
      ::VirtualIterator((VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
                         *)(&pIVar1->_vptr_IteratorCore + (long)local_28),
                        (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
                         *)(&(in_RDI[1]._core)->_vptr_IteratorCore + (long)local_28));
      VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
      ::~VirtualIterator(in_RDI);
    }
    Lib::free(in_RDI[1]._core);
  }
  in_RDI[1]._core = pIVar1;
  in_RDI[2]._core =
       (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
        *)(&(in_RDI[1]._core)->_vptr_IteratorCore + (long)in_RDI->_core);
  in_RDI[3]._core =
       (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
        *)(&(in_RDI[1]._core)->_vptr_IteratorCore + (long)local_38);
  in_RDI->_core = local_38;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }